

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O2

al_fixed al_fixsqrt(al_fixed x)

{
  al_fixed aVar1;
  double dVar2;
  
  if (0 < x) {
    dVar2 = (double)x * 1.52587890625e-05;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    aVar1 = al_ftofix(dVar2);
    return aVar1;
  }
  if (x < 0) {
    al_set_errno(0x21);
  }
  return 0;
}

Assistant:

al_fixed al_fixsqrt(al_fixed x)
{
   if (x > 0)
      return al_ftofix(sqrt(al_fixtof(x)));

   if (x < 0)
      al_set_errno(EDOM);

   return 0;
}